

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# immediate_operations.c
# Opt level: O0

void immediate_operations(arm7tdmi_t *state,thumbinstr_t *thminstr)

{
  ushort uVar1;
  uint uVar2;
  status_register_t *psVar3;
  uint uVar4;
  ushort *in_RSI;
  arm7tdmi_t *in_RDI;
  uint32_t result_3;
  uint32_t rddata_2;
  uint32_t result_1;
  uint32_t rddata_1;
  uint32_t result;
  uint32_t rddata;
  immediate_operations_t *instr;
  status_register_t *psr_3;
  status_register_t *psr_2;
  status_register_t *psr_1;
  status_register_t *psr;
  uint32_t value_2;
  uint32_t value_1;
  uint32_t value;
  uint32_t result_2;
  undefined8 in_stack_fffffffffffffd98;
  uint32_t new_pc;
  arm7tdmi_t *in_stack_fffffffffffffda0;
  uint32_t local_140;
  uint32_t local_130;
  uint32_t local_120;
  uint32_t local_54;
  uint32_t local_44;
  uint32_t local_34;
  uint32_t local_24;
  uint32_t local_14;
  uint32_t local_4;
  
  new_pc = (uint32_t)((ulong)in_stack_fffffffffffffd98 >> 0x20);
  switch(*in_RSI >> 0xb & 3) {
  case 0:
    uVar4 = (uint)(*in_RSI >> 8 & 7);
    uVar2 = (uint)(*in_RSI & 0xff);
    if (2 < gba_log_verbosity) {
      printf("[DEBUG] Set r%d to 0x%08X\n",(ulong)uVar4,(ulong)uVar2);
    }
    if (((((in_RDI->cpsr).raw & 0x1f) == 0x11) && (7 < uVar4)) && (uVar4 < 0xd)) {
      in_RDI->highreg_fiq[uVar4 - 8] = uVar2;
    }
    else if (uVar4 < 0xd) {
      in_RDI->r[uVar4] = uVar2;
    }
    else if (uVar4 == 0xd) {
      switch((in_RDI->cpsr).raw & 0x1f) {
      case 0x11:
        in_RDI->sp_fiq = uVar2;
        break;
      case 0x12:
        in_RDI->sp_irq = uVar2;
        break;
      case 0x13:
        in_RDI->sp_svc = uVar2;
        break;
      default:
        in_RDI->sp = uVar2;
        break;
      case 0x17:
        in_RDI->sp_abt = uVar2;
        break;
      case 0x1b:
        in_RDI->sp_und = uVar2;
      }
    }
    else if (uVar4 == 0xe) {
      switch((in_RDI->cpsr).raw & 0x1f) {
      case 0x11:
        in_RDI->lr_fiq = uVar2;
        break;
      case 0x12:
        in_RDI->lr_irq = uVar2;
        break;
      case 0x13:
        in_RDI->lr_svc = uVar2;
        break;
      default:
        in_RDI->lr = uVar2;
        break;
      case 0x17:
        in_RDI->lr_abt = uVar2;
        break;
      case 0x1b:
        in_RDI->lr_und = uVar2;
      }
    }
    else {
      if (uVar4 != 0xf) {
        fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
                "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/arm7tdmi/thumb_instr/../arm7tdmi.h"
                ,0xeb);
        fprintf(_stderr,"Attempted to write unknown register: r%d\n\x1b[0;m",(ulong)uVar4);
        exit(1);
      }
      if (((in_RDI->cpsr).raw >> 5 & 1) == 0) {
        set_pc(in_stack_fffffffffffffda0,new_pc);
      }
      else {
        set_pc(in_stack_fffffffffffffda0,new_pc);
      }
    }
    uVar1 = *in_RSI;
    psVar3 = get_psr(in_RDI);
    psVar3->raw = psVar3->raw & 0xbfffffff | (uint)((uVar1 & 0xff) == 0) << 0x1e;
    psVar3->raw = psVar3->raw & 0x7fffffff;
    break;
  case 1:
    uVar2 = (uint)(*in_RSI >> 8 & 7);
    if (((((in_RDI->cpsr).raw & 0x1f) == 0x11) && (7 < uVar2)) && (uVar2 < 0xd)) {
      local_120 = in_RDI->highreg_fiq[uVar2 - 8];
    }
    else if (uVar2 < 0xd) {
      local_120 = in_RDI->r[uVar2];
    }
    else if (uVar2 == 0xd) {
      switch((in_RDI->cpsr).raw & 0x1f) {
      case 0x11:
        local_54 = in_RDI->sp_fiq;
        break;
      case 0x12:
        local_54 = in_RDI->sp_irq;
        break;
      case 0x13:
        local_54 = in_RDI->sp_svc;
        break;
      default:
        local_54 = in_RDI->sp;
        break;
      case 0x17:
        local_54 = in_RDI->sp_abt;
        break;
      case 0x1b:
        local_54 = in_RDI->sp_und;
      }
      local_120 = local_54;
    }
    else if (uVar2 == 0xe) {
      switch((in_RDI->cpsr).raw & 0x1f) {
      case 0x11:
        local_24 = in_RDI->lr_fiq;
        break;
      case 0x12:
        local_24 = in_RDI->lr_irq;
        break;
      case 0x13:
        local_24 = in_RDI->lr_svc;
        break;
      default:
        local_24 = in_RDI->lr;
        break;
      case 0x17:
        local_24 = in_RDI->lr_abt;
        break;
      case 0x1b:
        local_24 = in_RDI->lr_und;
      }
      local_120 = local_24;
    }
    else {
      if (uVar2 != 0xf) {
        fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
                "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/arm7tdmi/thumb_instr/../arm7tdmi.h"
                ,0xa4);
        fprintf(_stderr,"Attempted to read unknown register: r%d\n\x1b[0;m",(ulong)uVar2);
        exit(1);
      }
      local_120 = in_RDI->pc;
    }
    uVar2 = local_120 - (*in_RSI & 0xff);
    psVar3 = get_psr(in_RDI);
    psVar3->raw = psVar3->raw & 0xbfffffff | (uint)(uVar2 == 0) << 0x1e;
    psVar3->raw = psVar3->raw & 0x7fffffff | (uint)((int)uVar2 < 0) << 0x1f;
    uVar4 = (uint)(*in_RSI & 0xff);
    (in_RDI->cpsr).raw = (in_RDI->cpsr).raw & 0xdfffffff | (uint)(uVar4 <= local_120) << 0x1d;
    (in_RDI->cpsr).raw =
         (in_RDI->cpsr).raw & 0xefffffff |
         (uint)((int)((local_120 ^ uVar4) & (uVar4 ^ 0xffffffff ^ uVar2)) < 0) << 0x1c;
    break;
  case 2:
    uVar2 = (uint)(*in_RSI >> 8 & 7);
    if (((((in_RDI->cpsr).raw & 0x1f) == 0x11) && (7 < uVar2)) && (uVar2 < 0xd)) {
      local_130 = in_RDI->highreg_fiq[uVar2 - 8];
    }
    else if (uVar2 < 0xd) {
      local_130 = in_RDI->r[uVar2];
    }
    else if (uVar2 == 0xd) {
      switch((in_RDI->cpsr).raw & 0x1f) {
      case 0x11:
        local_44 = in_RDI->sp_fiq;
        break;
      case 0x12:
        local_44 = in_RDI->sp_irq;
        break;
      case 0x13:
        local_44 = in_RDI->sp_svc;
        break;
      default:
        local_44 = in_RDI->sp;
        break;
      case 0x17:
        local_44 = in_RDI->sp_abt;
        break;
      case 0x1b:
        local_44 = in_RDI->sp_und;
      }
      local_130 = local_44;
    }
    else if (uVar2 == 0xe) {
      switch((in_RDI->cpsr).raw & 0x1f) {
      case 0x11:
        local_14 = in_RDI->lr_fiq;
        break;
      case 0x12:
        local_14 = in_RDI->lr_irq;
        break;
      case 0x13:
        local_14 = in_RDI->lr_svc;
        break;
      default:
        local_14 = in_RDI->lr;
        break;
      case 0x17:
        local_14 = in_RDI->lr_abt;
        break;
      case 0x1b:
        local_14 = in_RDI->lr_und;
      }
      local_130 = local_14;
    }
    else {
      if (uVar2 != 0xf) {
        fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
                "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/arm7tdmi/thumb_instr/../arm7tdmi.h"
                ,0xa4);
        fprintf(_stderr,"Attempted to read unknown register: r%d\n\x1b[0;m",(ulong)uVar2);
        exit(1);
      }
      local_130 = in_RDI->pc;
    }
    uVar2 = local_130 + (*in_RSI & 0xff);
    uVar1 = *in_RSI;
    (in_RDI->cpsr).raw =
         (in_RDI->cpsr).raw & 0xdfffffff |
         (uint)(0xffffffff < (ulong)local_130 + (ulong)(uVar1 & 0xff)) << 0x1d;
    (in_RDI->cpsr).raw =
         (in_RDI->cpsr).raw & 0xefffffff |
         (uint)(((ulong)(local_130 ^ local_130 + (uVar1 & 0xff)) &
                ((ulong)local_130 ^ 0xffffffffffffffff)) >> 0x1f != 0) << 0x1c;
    psVar3 = get_psr(in_RDI);
    psVar3->raw = psVar3->raw & 0xbfffffff | (uint)(uVar2 == 0) << 0x1e;
    psVar3->raw = psVar3->raw & 0x7fffffff | (uint)((int)uVar2 < 0) << 0x1f;
    uVar4 = (uint)(*in_RSI >> 8 & 7);
    if (2 < gba_log_verbosity) {
      printf("[DEBUG] Set r%d to 0x%08X\n",(ulong)uVar4,(ulong)uVar2);
    }
    if (((((in_RDI->cpsr).raw & 0x1f) == 0x11) && (7 < uVar4)) && (uVar4 < 0xd)) {
      in_RDI->highreg_fiq[uVar4 - 8] = uVar2;
    }
    else if (uVar4 < 0xd) {
      in_RDI->r[uVar4] = uVar2;
    }
    else if (uVar4 == 0xd) {
      switch((in_RDI->cpsr).raw & 0x1f) {
      case 0x11:
        in_RDI->sp_fiq = uVar2;
        break;
      case 0x12:
        in_RDI->sp_irq = uVar2;
        break;
      case 0x13:
        in_RDI->sp_svc = uVar2;
        break;
      default:
        in_RDI->sp = uVar2;
        break;
      case 0x17:
        in_RDI->sp_abt = uVar2;
        break;
      case 0x1b:
        in_RDI->sp_und = uVar2;
      }
    }
    else if (uVar4 == 0xe) {
      switch((in_RDI->cpsr).raw & 0x1f) {
      case 0x11:
        in_RDI->lr_fiq = uVar2;
        break;
      case 0x12:
        in_RDI->lr_irq = uVar2;
        break;
      case 0x13:
        in_RDI->lr_svc = uVar2;
        break;
      default:
        in_RDI->lr = uVar2;
        break;
      case 0x17:
        in_RDI->lr_abt = uVar2;
        break;
      case 0x1b:
        in_RDI->lr_und = uVar2;
      }
    }
    else {
      if (uVar4 != 0xf) {
        fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
                "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/arm7tdmi/thumb_instr/../arm7tdmi.h"
                ,0xeb);
        fprintf(_stderr,"Attempted to write unknown register: r%d\n\x1b[0;m",(ulong)uVar4);
        exit(1);
      }
      if (((in_RDI->cpsr).raw >> 5 & 1) == 0) {
        set_pc(in_stack_fffffffffffffda0,new_pc);
      }
      else {
        set_pc(in_stack_fffffffffffffda0,new_pc);
      }
    }
    break;
  case 3:
    uVar2 = (uint)(*in_RSI >> 8 & 7);
    if (((((in_RDI->cpsr).raw & 0x1f) == 0x11) && (7 < uVar2)) && (uVar2 < 0xd)) {
      local_140 = in_RDI->highreg_fiq[uVar2 - 8];
    }
    else if (uVar2 < 0xd) {
      local_140 = in_RDI->r[uVar2];
    }
    else if (uVar2 == 0xd) {
      switch((in_RDI->cpsr).raw & 0x1f) {
      case 0x11:
        local_34 = in_RDI->sp_fiq;
        break;
      case 0x12:
        local_34 = in_RDI->sp_irq;
        break;
      case 0x13:
        local_34 = in_RDI->sp_svc;
        break;
      default:
        local_34 = in_RDI->sp;
        break;
      case 0x17:
        local_34 = in_RDI->sp_abt;
        break;
      case 0x1b:
        local_34 = in_RDI->sp_und;
      }
      local_140 = local_34;
    }
    else if (uVar2 == 0xe) {
      switch((in_RDI->cpsr).raw & 0x1f) {
      case 0x11:
        local_4 = in_RDI->lr_fiq;
        break;
      case 0x12:
        local_4 = in_RDI->lr_irq;
        break;
      case 0x13:
        local_4 = in_RDI->lr_svc;
        break;
      default:
        local_4 = in_RDI->lr;
        break;
      case 0x17:
        local_4 = in_RDI->lr_abt;
        break;
      case 0x1b:
        local_4 = in_RDI->lr_und;
      }
      local_140 = local_4;
    }
    else {
      if (uVar2 != 0xf) {
        fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
                "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/arm7tdmi/thumb_instr/../arm7tdmi.h"
                ,0xa4);
        fprintf(_stderr,"Attempted to read unknown register: r%d\n\x1b[0;m",(ulong)uVar2);
        exit(1);
      }
      local_140 = in_RDI->pc;
    }
    uVar2 = local_140 - (*in_RSI & 0xff);
    uVar1 = *in_RSI;
    (in_RDI->cpsr).raw = (in_RDI->cpsr).raw & 0xdfffffff | (uint)(uVar2 <= local_140) << 0x1d;
    (in_RDI->cpsr).raw =
         (in_RDI->cpsr).raw & 0xefffffff |
         (uint)((int)((local_140 ^ uVar2) & (uVar2 ^ 0xffffffff ^ (uint)(uVar1 & 0xff))) < 0) <<
         0x1c;
    psVar3 = get_psr(in_RDI);
    psVar3->raw = psVar3->raw & 0xbfffffff | (uint)(uVar2 == 0) << 0x1e;
    psVar3->raw = psVar3->raw & 0x7fffffff | (uint)((int)uVar2 < 0) << 0x1f;
    uVar4 = (uint)(*in_RSI >> 8 & 7);
    if (2 < gba_log_verbosity) {
      printf("[DEBUG] Set r%d to 0x%08X\n",(ulong)uVar4,(ulong)uVar2);
    }
    if (((((in_RDI->cpsr).raw & 0x1f) == 0x11) && (7 < uVar4)) && (uVar4 < 0xd)) {
      in_RDI->highreg_fiq[uVar4 - 8] = uVar2;
    }
    else if (uVar4 < 0xd) {
      in_RDI->r[uVar4] = uVar2;
    }
    else if (uVar4 == 0xd) {
      switch((in_RDI->cpsr).raw & 0x1f) {
      case 0x11:
        in_RDI->sp_fiq = uVar2;
        break;
      case 0x12:
        in_RDI->sp_irq = uVar2;
        break;
      case 0x13:
        in_RDI->sp_svc = uVar2;
        break;
      default:
        in_RDI->sp = uVar2;
        break;
      case 0x17:
        in_RDI->sp_abt = uVar2;
        break;
      case 0x1b:
        in_RDI->sp_und = uVar2;
      }
    }
    else if (uVar4 == 0xe) {
      switch((in_RDI->cpsr).raw & 0x1f) {
      case 0x11:
        in_RDI->lr_fiq = uVar2;
        break;
      case 0x12:
        in_RDI->lr_irq = uVar2;
        break;
      case 0x13:
        in_RDI->lr_svc = uVar2;
        break;
      default:
        in_RDI->lr = uVar2;
        break;
      case 0x17:
        in_RDI->lr_abt = uVar2;
        break;
      case 0x1b:
        in_RDI->lr_und = uVar2;
      }
    }
    else {
      if (uVar4 != 0xf) {
        fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
                "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/arm7tdmi/thumb_instr/../arm7tdmi.h"
                ,0xeb);
        fprintf(_stderr,"Attempted to write unknown register: r%d\n\x1b[0;m",(ulong)uVar4);
        exit(1);
      }
      if (((in_RDI->cpsr).raw >> 5 & 1) == 0) {
        set_pc(in_stack_fffffffffffffda0,new_pc);
      }
      else {
        set_pc(in_stack_fffffffffffffda0,new_pc);
      }
    }
    break;
  default:
    fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
            "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/arm7tdmi/thumb_instr/immediate_operations.c"
            ,0x22);
    fprintf(_stderr,"immediate_operations: opc: %d rd: %d offset: %d\n\x1b[0;m",
            (ulong)(*in_RSI >> 0xb & 3),(ulong)(*in_RSI >> 8 & 7),(ulong)(*in_RSI & 0xff));
    exit(1);
  }
  return;
}

Assistant:

void immediate_operations(arm7tdmi_t* state, thumbinstr_t* thminstr) {
    immediate_operations_t* instr = &thminstr->IMMEDIATE_OPERATIONS;
    switch (instr->opcode) {
        case 0: // MOV
            set_register(state, instr->rd, instr->offset);
            set_flags_nz(state, instr->offset);
            break;
        case 1: { // CMP
            word rddata = get_register(state, instr->rd);
            word result = rddata - instr->offset;
            set_flags_nz(state, result);
            set_flags_sub(state, rddata, instr->offset, result);
            break;
        }
        case 2: { // ADD
            word rddata = get_register(state, instr->rd);
            word result = rddata + instr->offset;
            set_flags_add(state, rddata, instr->offset);
            set_flags_nz(state, result);
            set_register(state, instr->rd, result);
            break;
        }
        case 3: { // SUB
            word rddata = get_register(state, instr->rd);
            word result = rddata - instr->offset;
            set_flags_sub(state, rddata, result, instr->offset);
            set_flags_nz(state, result);
            set_register(state, instr->rd, result);
            break;
        }
        default:
            logfatal("immediate_operations: opc: %d rd: %d offset: %d", instr->opcode, instr->rd, instr->offset)
    }
}